

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic.hpp
# Opt level: O0

void boost::xpressive::detail::
     make_simple_repeat<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,boost::xpressive::detail::matcher_wrapper<boost::xpressive::detail::string_matcher<boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>,mpl_::bool_<false>>>>
               (quant_spec *spec,
               sequence<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *seq,matcher_wrapper<boost::xpressive::detail::string_matcher<boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>,_mpl_::bool_<false>_>_>
                    *xpr)

{
  simple_repeat_matcher<boost::xpressive::detail::matcher_wrapper<boost::xpressive::detail::string_matcher<boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>,_mpl_::bool_<false>_>_>,_mpl_::bool_<true>_>
  *in_RDX;
  sequence<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RSI;
  uint *in_RDI;
  simple_repeat_matcher<boost::xpressive::detail::matcher_wrapper<boost::xpressive::detail::string_matcher<boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>,_mpl_::bool_<false>_>_>,_mpl_::bool_<false>_>
  quant_1;
  simple_repeat_matcher<boost::xpressive::detail::matcher_wrapper<boost::xpressive::detail::string_matcher<boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>,_mpl_::bool_<false>_>_>,_mpl_::bool_<true>_>
  quant;
  sequence<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffea8;
  uint in_stack_fffffffffffffeb0;
  uint max;
  uint in_stack_fffffffffffffeb4;
  uint min;
  matcher_wrapper<boost::xpressive::detail::string_matcher<boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>,_mpl_::bool_<false>_>_>
  *in_stack_fffffffffffffeb8;
  simple_repeat_matcher<boost::xpressive::detail::matcher_wrapper<boost::xpressive::detail::string_matcher<boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>,_mpl_::bool_<false>_>_>,_mpl_::bool_<false>_>
  *in_stack_fffffffffffffec0;
  simple_repeat_matcher<boost::xpressive::detail::matcher_wrapper<boost::xpressive::detail::string_matcher<boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>,_mpl_::bool_<false>_>_>,_mpl_::bool_<true>_>
  *in_stack_fffffffffffffed8;
  width local_f0;
  matcher_wrapper<boost::xpressive::detail::string_matcher<boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>,_mpl_::bool_<false>_>_>
  local_e8 [3];
  width local_60 [12];
  
  if ((in_RDI[2] & 1) == 0) {
    max = *in_RDI;
    min = in_RDI[1];
    local_f0 = sequence<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::width(in_RSI);
    width::value(&local_f0);
    simple_repeat_matcher<boost::xpressive::detail::matcher_wrapper<boost::xpressive::detail::string_matcher<boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>,_mpl_::bool_<false>_>_>,_mpl_::bool_<false>_>
    ::simple_repeat_matcher(in_stack_fffffffffffffec0,local_e8,min,max,(size_t)in_RDX);
    make_dynamic<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,boost::xpressive::detail::simple_repeat_matcher<boost::xpressive::detail::matcher_wrapper<boost::xpressive::detail::string_matcher<boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>,mpl_::bool_<false>>>,mpl_::bool_<false>>>
              ((simple_repeat_matcher<boost::xpressive::detail::matcher_wrapper<boost::xpressive::detail::string_matcher<boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>,_mpl_::bool_<false>_>_>,_mpl_::bool_<false>_>
                *)in_stack_fffffffffffffed8);
    sequence<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator=((sequence<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)CONCAT44(min,max),
                (sequence<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)in_RDX);
    sequence<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~sequence((sequence<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)CONCAT44(min,max));
    simple_repeat_matcher<boost::xpressive::detail::matcher_wrapper<boost::xpressive::detail::string_matcher<boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>,_mpl_::bool_<false>_>_>,_mpl_::bool_<false>_>
    ::~simple_repeat_matcher
              ((simple_repeat_matcher<boost::xpressive::detail::matcher_wrapper<boost::xpressive::detail::string_matcher<boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>,_mpl_::bool_<false>_>_>,_mpl_::bool_<false>_>
                *)0x1551b7);
  }
  else {
    local_60[0] = sequence<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::width(in_RSI);
    width::value(local_60);
    simple_repeat_matcher<boost::xpressive::detail::matcher_wrapper<boost::xpressive::detail::string_matcher<boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>,_mpl_::bool_<false>_>_>,_mpl_::bool_<true>_>
    ::simple_repeat_matcher
              (in_RDX,in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0,
               (size_t)in_stack_fffffffffffffea8);
    make_dynamic<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,boost::xpressive::detail::simple_repeat_matcher<boost::xpressive::detail::matcher_wrapper<boost::xpressive::detail::string_matcher<boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>,mpl_::bool_<false>>>,mpl_::bool_<true>>>
              (in_stack_fffffffffffffed8);
    sequence<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator=((sequence<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
                in_stack_fffffffffffffea8);
    sequence<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~sequence((sequence<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0));
    simple_repeat_matcher<boost::xpressive::detail::matcher_wrapper<boost::xpressive::detail::string_matcher<boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>,_mpl_::bool_<false>_>_>,_mpl_::bool_<true>_>
    ::~simple_repeat_matcher
              ((simple_repeat_matcher<boost::xpressive::detail::matcher_wrapper<boost::xpressive::detail::string_matcher<boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>,_mpl_::bool_<false>_>_>,_mpl_::bool_<true>_>
                *)0x1550fa);
  }
  return;
}

Assistant:

inline void
make_simple_repeat(quant_spec const &spec, sequence<BidiIter> &seq, Xpr const &xpr)
{
    if(spec.greedy_)
    {
        simple_repeat_matcher<Xpr, mpl::true_> quant(xpr, spec.min_, spec.max_, seq.width().value());
        seq = make_dynamic<BidiIter>(quant);
    }
    else
    {
        simple_repeat_matcher<Xpr, mpl::false_> quant(xpr, spec.min_, spec.max_, seq.width().value());
        seq = make_dynamic<BidiIter>(quant);
    }
}